

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::anon_unknown_1::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  long *plVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Reflection *this;
  ulong uVar8;
  int iVar9;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string fieldval;
  string name;
  string local_160;
  int local_13c;
  Message *local_138;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_108;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f0;
  string local_e8;
  Reflection *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  _Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false> local_a0;
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  local_98;
  _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  local_68;
  
  local_f0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = options;
  local_c8 = this;
  Reflection::ListFields(this,options,&local_108);
  if (local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar1 = &local_e8.field_2;
    local_12c = depth + 1;
    local_c0 = (long)(depth * 2);
    uVar8 = 0;
    do {
      local_13c = *(int *)(local_108.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x3c);
      iVar4 = 1;
      if (local_13c == 3) {
        iVar4 = Reflection::FieldSize
                          (local_c8,local_138,
                           local_108.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8]);
        if (0 < iVar4) goto LAB_002e178e;
      }
      else {
LAB_002e178e:
        iVar9 = 0;
        do {
          local_e8._M_string_length = 0;
          local_e8.field_2._M_local_buf[0] = '\0';
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_108.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8];
          local_e8._M_dataplus._M_p = (pointer)paVar1;
          if (*(once_flag **)(paVar7->_M_local_buf + 0x30) != (once_flag *)0x0) {
            local_b8._0_8_ = FieldDescriptor::TypeOnceInit;
            local_160._M_dataplus._M_p = (pointer)paVar7;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(paVar7->_M_local_buf + 0x30),
                       (_func_void_FieldDescriptor_ptr **)local_b8,(FieldDescriptor **)&local_160);
          }
          if ((*(uint *)(paVar7->_M_local_buf + 0x38) & 0xfffffffe) == 10) {
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            local_160._M_string_length = 0;
            local_160.field_2._M_allocated_capacity =
                 local_160.field_2._M_allocated_capacity & 0xffffffffffffff00;
            TextFormat::Printer::Printer((Printer *)local_b8);
            local_b8._0_4_ = local_12c;
            iVar6 = -1;
            if (local_13c == 3) {
              iVar6 = iVar9;
            }
            TextFormat::Printer::PrintFieldValueToString
                      ((Printer *)local_b8,local_138,
                       local_108.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar6,&local_160);
            std::__cxx11::string::append((char *)&local_e8);
            std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_160._M_dataplus._M_p);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_e8,local_e8._M_string_length,0,(char)local_c0);
            std::__cxx11::string::append((char *)&local_e8);
            std::
            _Rb_tree<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
            ::~_Rb_tree(&local_68);
            std::
            _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
            ::~_Rb_tree(&local_98);
            if (local_a0._M_head_impl != (FastFieldValuePrinter *)0x0) {
              (*(local_a0._M_head_impl)->_vptr_FastFieldValuePrinter[1])();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
          }
          else {
            iVar6 = -1;
            if (local_13c == 3) {
              iVar6 = iVar9;
            }
            TextFormat::PrintFieldValueToString
                      (local_138,
                       local_108.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar6,&local_e8);
          }
          local_b8._0_8_ = local_a8;
          local_b8._8_8_ = 0;
          local_a8[0] = (_func_void_FieldDescriptor_ptr)0x0;
          if (local_108.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8][0x42] == (FieldDescriptor)0x1) {
            std::operator+(&local_128,"(.",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (local_108.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar8] + 8));
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar7) {
              local_160.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_160.field_2._8_8_ = plVar5[3];
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            }
            else {
              local_160.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_160._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_160._M_string_length = plVar5[1];
            *plVar5 = (long)paVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_b8,(string *)&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)local_b8);
          }
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,local_b8._0_8_,
                     (_func_void_FieldDescriptor_ptr *)(local_b8._0_8_ + local_b8._8_8_));
          std::__cxx11::string::append((char *)&local_128);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_128,(ulong)local_e8._M_dataplus._M_p);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar7) {
            local_160.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_160.field_2._8_8_ = plVar5[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_160._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_160._M_string_length = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f0,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          if ((undefined1 *)local_b8._0_8_ != local_a8) {
            operator_delete((void *)local_b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != paVar1) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          iVar9 = iVar9 + 1;
        } while (iVar4 != iVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_108.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_108.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pbVar2 = *(pointer *)local_f0;
  pbVar3 = *(pointer *)(local_f0 + 8);
  if (local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pbVar2 != pbVar3;
}

Assistant:

bool RetrieveOptionsAssumingRightPool(
    int depth, const Message& options,
    std::vector<std::string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      std::string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        std::string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i], repeated ? j : -1,
                                        &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      std::string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}